

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QString,_QList<int>_>_>::freeData
          (Span<QHashPrivate::Node<QString,_QList<int>_>_> *this)

{
  long lVar1;
  
  if (*(long *)(this + 0x80) != 0) {
    for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 1) {
      if ((ulong)(byte)this[lVar1] != 0xff) {
        Node<QString,_QList<int>_>::~Node
                  ((Node<QString,_QList<int>_> *)
                   ((ulong)(byte)this[lVar1] * 0x30 + *(long *)(this + 0x80)));
      }
    }
    if (*(void **)(this + 0x80) != (void *)0x0) {
      operator_delete__(*(void **)(this + 0x80));
    }
    *(undefined8 *)(this + 0x80) = 0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }